

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall
cppforth::Forth::split_str
          (Forth *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,string *delimiters)

{
  size_type __n;
  size_type __n_00;
  size_type __pos;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  __n = delimiters->_M_string_length;
  __n_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (str,(delimiters->_M_dataplus)._M_p,0,__n);
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (str,(delimiters->_M_dataplus)._M_p,__n_00 + __n,delimiters->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,str,0,__n_00);
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(str,(delimiters->_M_dataplus)._M_p,__n_00,delimiters->_M_string_length);
  while (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,str,__n_00 + __n,__pos - (__n_00 + __n));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    __n_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (str,(delimiters->_M_dataplus)._M_p,__pos,delimiters->_M_string_length);
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (str,(delimiters->_M_dataplus)._M_p,__n_00 + __n,delimiters->_M_string_length)
    ;
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(str,(delimiters->_M_dataplus)._M_p,__n_00,delimiters->_M_string_length
                             );
  }
  return;
}

Assistant:

void split_str(const std::string& str, std::vector<std::string>& tokens, const std::string& delimiters)
		{
			std::string::size_type delimitersSize = delimiters.size();
			std::string::size_type pos = str.find(delimiters, 0);
			std::string::size_type lastPos = str.find(delimiters, pos + delimitersSize);
			tokens.push_back(str.substr(0, pos));

			while (str.find_first_not_of(delimiters, pos) != std::wstring::npos)
			{
				tokens.push_back(str.substr(pos + delimitersSize, lastPos - pos - delimitersSize));
				pos = str.find(delimiters, lastPos);
				lastPos = str.find(delimiters, pos + delimitersSize);
			}
		}